

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_ObjAwaken(FParser *this)

{
  AActor *this_00;
  AActor *activator;
  
  if (this->t_argc == 0) {
    this_00 = (this->Script->trigger).field_0.p;
    if ((this_00 != (AActor *)0x0) &&
       (((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      this_00 = (AActor *)0x0;
    }
  }
  else {
    this_00 = actorvalue(this->t_argv);
  }
  if (this_00 != (AActor *)0x0) {
    activator = (this->Script->trigger).field_0.p;
    if ((activator != (AActor *)0x0) &&
       (((activator->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      activator = (AActor *)0x0;
    }
    AActor::CallActivate(this_00,activator);
    return;
  }
  return;
}

Assistant:

void FParser::SF_ObjAwaken(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
   	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(mo)
	{
		mo->CallActivate(Script->trigger);
	}
}